

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 uVar14;
  int iVar15;
  long lVar16;
  Scene *pSVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong unaff_R15;
  size_t mask;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  uint uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  uint uVar63;
  uint uVar64;
  uint uVar65;
  undefined1 auVar62 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_26c0 [16];
  Scene *local_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  Geometry *local_2688;
  ulong local_2680;
  ulong local_2678;
  ulong local_2670;
  undefined8 *local_2668;
  undefined1 (*local_2660) [16];
  long local_2658;
  ulong local_2650;
  ulong local_2648;
  RTCFilterFunctionNArguments local_2640;
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25b0 [16];
  float local_25a0 [4];
  float local_2590 [4];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [2] [16];
  undefined1 local_2530 [16];
  undefined8 local_2520;
  undefined8 uStack_2518;
  RTCHitN local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  float local_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_2660 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar41 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar80 = ZEXT3264(CONCAT428(fVar41,CONCAT424(fVar41,CONCAT420(fVar41,CONCAT416(fVar41,CONCAT412(
                                                  fVar41,CONCAT48(fVar41,CONCAT44(fVar41,fVar41)))))
                                               )));
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23c0._4_4_ = fVar44;
  local_23c0._0_4_ = fVar44;
  local_23c0._8_4_ = fVar44;
  local_23c0._12_4_ = fVar44;
  local_23c0._16_4_ = fVar44;
  local_23c0._20_4_ = fVar44;
  local_23c0._24_4_ = fVar44;
  local_23c0._28_4_ = fVar44;
  auVar51 = ZEXT3264(local_23c0);
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_23e0._4_4_ = fVar45;
  local_23e0._0_4_ = fVar45;
  local_23e0._8_4_ = fVar45;
  local_23e0._12_4_ = fVar45;
  local_23e0._16_4_ = fVar45;
  local_23e0._20_4_ = fVar45;
  local_23e0._24_4_ = fVar45;
  local_23e0._28_4_ = fVar45;
  auVar54 = ZEXT3264(local_23e0);
  fVar41 = fVar41 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar44 = fVar44 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar45 = fVar45 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar25 = uVar24 ^ 0x20;
  local_2648 = uVar22 ^ 0x20;
  iVar15 = (tray->tfar).field_0.i[k];
  auVar31 = ZEXT3264(CONCAT428(iVar15,CONCAT424(iVar15,CONCAT420(iVar15,CONCAT416(iVar15,CONCAT412(
                                                  iVar15,CONCAT48(iVar15,CONCAT44(iVar15,iVar15)))))
                                               )));
  local_2650 = uVar18 ^ 0x20;
  local_2400._0_8_ = CONCAT44(fVar41,fVar41) ^ 0x8000000080000000;
  local_2400._8_4_ = -fVar41;
  local_2400._12_4_ = -fVar41;
  local_2400._16_4_ = -fVar41;
  local_2400._20_4_ = -fVar41;
  local_2400._24_4_ = -fVar41;
  local_2400._28_4_ = -fVar41;
  auVar57 = ZEXT3264(local_2400);
  local_2420._0_8_ = CONCAT44(fVar44,fVar44) ^ 0x8000000080000000;
  local_2420._8_4_ = -fVar44;
  local_2420._12_4_ = -fVar44;
  local_2420._16_4_ = -fVar44;
  local_2420._20_4_ = -fVar44;
  local_2420._24_4_ = -fVar44;
  local_2420._28_4_ = -fVar44;
  auVar62 = ZEXT3264(local_2420);
  local_2440._0_8_ = CONCAT44(fVar45,fVar45) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar45;
  local_2440._12_4_ = -fVar45;
  local_2440._16_4_ = -fVar45;
  local_2440._20_4_ = -fVar45;
  local_2440._24_4_ = -fVar45;
  local_2440._28_4_ = -fVar45;
  auVar68 = ZEXT3264(local_2440);
  iVar15 = (tray->tnear).field_0.i[k];
  local_2460._4_4_ = iVar15;
  local_2460._0_4_ = iVar15;
  local_2460._8_4_ = iVar15;
  local_2460._12_4_ = iVar15;
  local_2460._16_4_ = iVar15;
  local_2460._20_4_ = iVar15;
  local_2460._24_4_ = iVar15;
  local_2460._28_4_ = iVar15;
  auVar71 = ZEXT3264(local_2460);
  local_2668 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  do {
    do {
      do {
        if (local_2660 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar23 = local_2660 + -1;
        local_2660 = local_2660 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar23 + 8));
      uVar28 = *(ulong *)*local_2660;
      do {
        auVar67 = auVar68._0_32_;
        auVar61 = auVar62._0_32_;
        auVar56 = auVar57._0_32_;
        auVar53 = auVar54._0_32_;
        auVar50 = auVar51._0_32_;
        if ((uVar28 & 8) == 0) {
          auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar28 + 0x40 + uVar24),auVar56,
                                    auVar80._0_32_);
          auVar39 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar28 + 0x40 + uVar22),auVar61,auVar50);
          auVar9 = vpmaxsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar39));
          auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar28 + 0x40 + uVar18),auVar67,auVar53);
          auVar10 = vpmaxsd_avx2(ZEXT1632(auVar32),auVar71._0_32_);
          local_2600 = vpmaxsd_avx2(auVar9,auVar10);
          auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar28 + 0x40 + uVar25),auVar56,
                                    auVar80._0_32_);
          auVar39 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar28 + 0x40 + local_2648),auVar61,
                                    auVar50);
          auVar9 = vpminsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar39));
          auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar28 + 0x40 + local_2650),auVar67,
                                    auVar53);
          auVar10 = vpminsd_avx2(ZEXT1632(auVar32),auVar31._0_32_);
          auVar9 = vpminsd_avx2(auVar9,auVar10);
          auVar9 = vpcmpgtd_avx2(local_2600,auVar9);
          uVar14 = vmovmskps_avx(auVar9);
          unaff_R15 = (ulong)(byte)~(byte)uVar14;
        }
        if ((uVar28 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar15 = 4;
          }
          else {
            uVar27 = uVar28 & 0xfffffffffffffff0;
            lVar26 = 0;
            for (uVar28 = unaff_R15; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              lVar26 = lVar26 + 1;
            }
            iVar15 = 0;
            uVar20 = unaff_R15 - 1 & unaff_R15;
            uVar28 = *(ulong *)(uVar27 + lVar26 * 8);
            if (uVar20 != 0) {
              uVar58 = *(uint *)(local_2600 + lVar26 * 4);
              lVar26 = 0;
              for (uVar11 = uVar20; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                lVar26 = lVar26 + 1;
              }
              uVar20 = uVar20 - 1 & uVar20;
              uVar11 = *(ulong *)(uVar27 + lVar26 * 8);
              uVar63 = *(uint *)(local_2600 + lVar26 * 4);
              if (uVar20 == 0) {
                if (uVar58 < uVar63) {
                  *(ulong *)*local_2660 = uVar11;
                  *(uint *)(*local_2660 + 8) = uVar63;
                  local_2660 = local_2660 + 1;
                }
                else {
                  *(ulong *)*local_2660 = uVar28;
                  *(uint *)(*local_2660 + 8) = uVar58;
                  local_2660 = local_2660 + 1;
                  uVar28 = uVar11;
                }
              }
              else {
                auVar32._8_8_ = 0;
                auVar32._0_8_ = uVar28;
                auVar32 = vpunpcklqdq_avx(auVar32,ZEXT416(uVar58));
                auVar39._8_8_ = 0;
                auVar39._0_8_ = uVar11;
                auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar63));
                lVar26 = 0;
                for (uVar28 = uVar20; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
                {
                  lVar26 = lVar26 + 1;
                }
                uVar20 = uVar20 - 1 & uVar20;
                auVar42._8_8_ = 0;
                auVar42._0_8_ = *(ulong *)(uVar27 + lVar26 * 8);
                auVar33 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)(local_2600 + lVar26 * 4)));
                auVar42 = vpcmpgtd_avx(auVar39,auVar32);
                if (uVar20 == 0) {
                  auVar47 = vpshufd_avx(auVar42,0xaa);
                  auVar42 = vblendvps_avx(auVar39,auVar32,auVar47);
                  auVar32 = vblendvps_avx(auVar32,auVar39,auVar47);
                  auVar39 = vpcmpgtd_avx(auVar33,auVar42);
                  auVar47 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar33,auVar42,auVar47);
                  auVar42 = vblendvps_avx(auVar42,auVar33,auVar47);
                  auVar33 = vpcmpgtd_avx(auVar42,auVar32);
                  auVar47 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar42,auVar32,auVar47);
                  auVar32 = vblendvps_avx(auVar32,auVar42,auVar47);
                  *local_2660 = auVar32;
                  local_2660[1] = auVar33;
                  uVar28 = auVar39._0_8_;
                  local_2660 = local_2660 + 2;
                }
                else {
                  lVar26 = 0;
                  for (uVar28 = uVar20; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000
                      ) {
                    lVar26 = lVar26 + 1;
                  }
                  uVar20 = uVar20 - 1 & uVar20;
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = *(ulong *)(uVar27 + lVar26 * 8);
                  auVar47 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_2600 + lVar26 * 4)));
                  if (uVar20 == 0) {
                    auVar43 = vpshufd_avx(auVar42,0xaa);
                    auVar42 = vblendvps_avx(auVar39,auVar32,auVar43);
                    auVar32 = vblendvps_avx(auVar32,auVar39,auVar43);
                    auVar39 = vpcmpgtd_avx(auVar47,auVar33);
                    auVar43 = vpshufd_avx(auVar39,0xaa);
                    auVar39 = vblendvps_avx(auVar47,auVar33,auVar43);
                    auVar33 = vblendvps_avx(auVar33,auVar47,auVar43);
                    auVar47 = vpcmpgtd_avx(auVar33,auVar32);
                    auVar43 = vpshufd_avx(auVar47,0xaa);
                    auVar47 = vblendvps_avx(auVar33,auVar32,auVar43);
                    auVar32 = vblendvps_avx(auVar32,auVar33,auVar43);
                    auVar33 = vpcmpgtd_avx(auVar39,auVar42);
                    auVar43 = vpshufd_avx(auVar33,0xaa);
                    auVar33 = vblendvps_avx(auVar39,auVar42,auVar43);
                    auVar39 = vblendvps_avx(auVar42,auVar39,auVar43);
                    auVar42 = vpcmpgtd_avx(auVar47,auVar39);
                    auVar43 = vpshufd_avx(auVar42,0xaa);
                    auVar42 = vblendvps_avx(auVar47,auVar39,auVar43);
                    auVar39 = vblendvps_avx(auVar39,auVar47,auVar43);
                    *local_2660 = auVar32;
                    local_2660[1] = auVar39;
                    local_2660[2] = auVar42;
                    uVar28 = auVar33._0_8_;
                    pauVar23 = local_2660 + 3;
                  }
                  else {
                    *local_2660 = auVar32;
                    local_2660[1] = auVar39;
                    local_2660[2] = auVar33;
                    local_2660[3] = auVar47;
                    lVar26 = 0x30;
                    do {
                      lVar16 = lVar26;
                      lVar26 = 0;
                      for (uVar28 = uVar20; (uVar28 & 1) == 0;
                          uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                        lVar26 = lVar26 + 1;
                      }
                      auVar33._8_8_ = 0;
                      auVar33._0_8_ = *(ulong *)(uVar27 + lVar26 * 8);
                      auVar32 = vpunpcklqdq_avx(auVar33,ZEXT416(*(uint *)(local_2600 + lVar26 * 4)))
                      ;
                      *(undefined1 (*) [16])(local_2660[1] + lVar16) = auVar32;
                      uVar20 = uVar20 - 1 & uVar20;
                      lVar26 = lVar16 + 0x10;
                    } while (uVar20 != 0);
                    pauVar23 = (undefined1 (*) [16])(local_2660[1] + lVar16);
                    if (lVar16 + 0x10 != 0) {
                      lVar26 = 0x10;
                      pauVar19 = local_2660;
                      do {
                        auVar32 = pauVar19[1];
                        uVar58 = *(uint *)(pauVar19[1] + 8);
                        pauVar19 = pauVar19 + 1;
                        lVar16 = lVar26;
                        do {
                          if (uVar58 <= *(uint *)(local_2660[-1] + lVar16 + 8)) {
                            pauVar21 = (undefined1 (*) [16])(*local_2660 + lVar16);
                            break;
                          }
                          *(undefined1 (*) [16])(*local_2660 + lVar16) =
                               *(undefined1 (*) [16])(local_2660[-1] + lVar16);
                          lVar16 = lVar16 + -0x10;
                          pauVar21 = local_2660;
                        } while (lVar16 != 0);
                        *pauVar21 = auVar32;
                        lVar26 = lVar26 + 0x10;
                      } while (pauVar23 != pauVar19);
                    }
                    uVar28 = *(ulong *)*pauVar23;
                  }
                  auVar51 = ZEXT3264(auVar50);
                  auVar54 = ZEXT3264(auVar53);
                  auVar57 = ZEXT3264(auVar56);
                  auVar62 = ZEXT3264(auVar61);
                  auVar68 = ZEXT3264(auVar67);
                  auVar71 = ZEXT3264(auVar71._0_32_);
                  local_2660 = pauVar23;
                  iVar15 = 0;
                }
              }
            }
          }
        }
        else {
          iVar15 = 6;
        }
      } while (iVar15 == 0);
    } while (iVar15 != 6);
    local_2658 = (ulong)((uint)uVar28 & 0xf) - 8;
    if (local_2658 != 0) {
      uVar28 = uVar28 & 0xfffffffffffffff0;
      lVar26 = 0;
      do {
        lVar16 = lVar26 * 0x50;
        pSVar17 = context->scene;
        ppfVar3 = (pSVar17->vertices).items;
        pfVar4 = ppfVar3[*(uint *)(uVar28 + 0x30 + lVar16)];
        pfVar5 = ppfVar3[*(uint *)(uVar28 + 0x34 + lVar16)];
        pfVar6 = ppfVar3[*(uint *)(uVar28 + 0x38 + lVar16)];
        pfVar7 = ppfVar3[*(uint *)(uVar28 + 0x3c + lVar16)];
        auVar42 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar28 + lVar16)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 8 + lVar16)));
        auVar32 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar28 + lVar16)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 8 + lVar16)));
        auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 4 + lVar16)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar28 + 0xc + lVar16)));
        auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 4 + lVar16)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar28 + 0xc + lVar16)));
        auVar35 = vunpcklps_avx(auVar32,auVar39);
        auVar40 = vunpcklps_avx(auVar42,auVar33);
        auVar49 = vunpckhps_avx(auVar42,auVar33);
        auVar42 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar28 + 0x10 + lVar16)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 0x18 + lVar16)));
        auVar32 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar28 + 0x10 + lVar16)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 0x18 + lVar16)));
        auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 0x14 + lVar16)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar28 + 0x1c + lVar16)));
        auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 0x14 + lVar16)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar28 + 0x1c + lVar16)));
        auVar43 = vunpcklps_avx(auVar32,auVar39);
        auVar29 = vunpcklps_avx(auVar42,auVar33);
        auVar32 = vunpckhps_avx(auVar42,auVar33);
        auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar28 + 0x20 + lVar16)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 0x28 + lVar16)));
        auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar28 + 0x20 + lVar16)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 0x28 + lVar16)));
        auVar47 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 0x24 + lVar16)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar28 + 0x2c + lVar16)));
        auVar42 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 0x24 + lVar16)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar28 + 0x2c + lVar16)));
        auVar34 = vunpcklps_avx(auVar39,auVar42);
        auVar52 = vunpcklps_avx(auVar33,auVar47);
        auVar47 = vunpckhps_avx(auVar33,auVar47);
        puVar1 = (undefined8 *)(uVar28 + 0x30 + lVar16);
        local_2520 = *puVar1;
        uStack_2518 = puVar1[1];
        puVar1 = (undefined8 *)(uVar28 + 0x40 + lVar16);
        local_2610 = *puVar1;
        uStack_2608 = puVar1[1];
        auVar39 = vsubps_avx(auVar40,auVar29);
        auVar32 = vsubps_avx(auVar49,auVar32);
        auVar42 = vsubps_avx(auVar35,auVar43);
        auVar33 = vsubps_avx(auVar52,auVar40);
        auVar47 = vsubps_avx(auVar47,auVar49);
        auVar43 = vsubps_avx(auVar34,auVar35);
        auVar29._0_4_ = auVar43._0_4_ * auVar32._0_4_;
        auVar29._4_4_ = auVar43._4_4_ * auVar32._4_4_;
        auVar29._8_4_ = auVar43._8_4_ * auVar32._8_4_;
        auVar29._12_4_ = auVar43._12_4_ * auVar32._12_4_;
        local_2570 = vfmsub231ps_fma(auVar29,auVar47,auVar42);
        auVar34._0_4_ = auVar42._0_4_ * auVar33._0_4_;
        auVar34._4_4_ = auVar42._4_4_ * auVar33._4_4_;
        auVar34._8_4_ = auVar42._8_4_ * auVar33._8_4_;
        auVar34._12_4_ = auVar42._12_4_ * auVar33._12_4_;
        local_2560 = vfmsub231ps_fma(auVar34,auVar43,auVar39);
        uVar14 = *(undefined4 *)(ray + k * 4);
        auVar72._4_4_ = uVar14;
        auVar72._0_4_ = uVar14;
        auVar72._8_4_ = uVar14;
        auVar72._12_4_ = uVar14;
        uVar14 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar74._4_4_ = uVar14;
        auVar74._0_4_ = uVar14;
        auVar74._8_4_ = uVar14;
        auVar74._12_4_ = uVar14;
        uVar14 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar77._4_4_ = uVar14;
        auVar77._0_4_ = uVar14;
        auVar77._8_4_ = uVar14;
        auVar77._12_4_ = uVar14;
        fVar41 = *(float *)(ray + k * 4 + 0x40);
        auVar66._4_4_ = fVar41;
        auVar66._0_4_ = fVar41;
        auVar66._8_4_ = fVar41;
        auVar66._12_4_ = fVar41;
        auVar40 = vsubps_avx(auVar40,auVar72);
        fVar44 = *(float *)(ray + k * 4 + 0x50);
        auVar73._4_4_ = fVar44;
        auVar73._0_4_ = fVar44;
        auVar73._8_4_ = fVar44;
        auVar73._12_4_ = fVar44;
        auVar49 = vsubps_avx(auVar49,auVar74);
        fVar45 = *(float *)(ray + k * 4 + 0x60);
        auVar75._4_4_ = fVar45;
        auVar75._0_4_ = fVar45;
        auVar75._8_4_ = fVar45;
        auVar75._12_4_ = fVar45;
        auVar35 = vsubps_avx(auVar35,auVar77);
        auVar78._0_4_ = fVar41 * auVar49._0_4_;
        auVar78._4_4_ = fVar41 * auVar49._4_4_;
        auVar78._8_4_ = fVar41 * auVar49._8_4_;
        auVar78._12_4_ = fVar41 * auVar49._12_4_;
        auVar29 = vfmsub231ps_fma(auVar78,auVar40,auVar73);
        auVar69._0_4_ = auVar43._0_4_ * auVar29._0_4_;
        auVar69._4_4_ = auVar43._4_4_ * auVar29._4_4_;
        auVar69._8_4_ = auVar43._8_4_ * auVar29._8_4_;
        auVar69._12_4_ = auVar43._12_4_ * auVar29._12_4_;
        auVar79._0_4_ = auVar42._0_4_ * auVar29._0_4_;
        auVar79._4_4_ = auVar42._4_4_ * auVar29._4_4_;
        auVar79._8_4_ = auVar42._8_4_ * auVar29._8_4_;
        auVar79._12_4_ = auVar42._12_4_ * auVar29._12_4_;
        auVar59._0_4_ = fVar45 * auVar40._0_4_;
        auVar59._4_4_ = fVar45 * auVar40._4_4_;
        auVar59._8_4_ = fVar45 * auVar40._8_4_;
        auVar59._12_4_ = fVar45 * auVar40._12_4_;
        auVar43 = vfmsub231ps_fma(auVar59,auVar35,auVar66);
        auVar42 = vfmadd231ps_fma(auVar69,auVar43,auVar47);
        auVar43 = vfmadd231ps_fma(auVar79,auVar32,auVar43);
        auVar55._0_4_ = auVar47._0_4_ * auVar39._0_4_;
        auVar55._4_4_ = auVar47._4_4_ * auVar39._4_4_;
        auVar55._8_4_ = auVar47._8_4_ * auVar39._8_4_;
        auVar55._12_4_ = auVar47._12_4_ * auVar39._12_4_;
        local_2550[0] = vfmsub231ps_fma(auVar55,auVar33,auVar32);
        auVar52._0_4_ = fVar44 * auVar35._0_4_;
        auVar52._4_4_ = fVar44 * auVar35._4_4_;
        auVar52._8_4_ = fVar44 * auVar35._8_4_;
        auVar52._12_4_ = fVar44 * auVar35._12_4_;
        auVar29 = vfmsub231ps_fma(auVar52,auVar49,auVar75);
        auVar76._0_4_ = local_2550[0]._0_4_ * fVar45;
        auVar76._4_4_ = local_2550[0]._4_4_ * fVar45;
        auVar76._8_4_ = local_2550[0]._8_4_ * fVar45;
        auVar76._12_4_ = local_2550[0]._12_4_ * fVar45;
        auVar32 = vfmadd231ps_fma(auVar76,local_2560,auVar73);
        auVar47 = vfmadd231ps_fma(auVar32,local_2570,auVar66);
        auVar60._8_4_ = 0x80000000;
        auVar60._0_8_ = 0x8000000080000000;
        auVar60._12_4_ = 0x80000000;
        auVar42 = vfmadd231ps_fma(auVar42,auVar29,auVar33);
        auVar32 = vandps_avx(auVar47,auVar60);
        uVar58 = auVar32._0_4_;
        local_2600._0_4_ = (float)(uVar58 ^ auVar42._0_4_);
        uVar63 = auVar32._4_4_;
        local_2600._4_4_ = (float)(uVar63 ^ auVar42._4_4_);
        uVar64 = auVar32._8_4_;
        local_2600._8_4_ = (float)(uVar64 ^ auVar42._8_4_);
        uVar65 = auVar32._12_4_;
        local_2600._12_4_ = (float)(uVar65 ^ auVar42._12_4_);
        auVar32 = vfmadd231ps_fma(auVar43,auVar39,auVar29);
        local_2600._16_4_ = (float)(uVar58 ^ auVar32._0_4_);
        local_2600._20_4_ = (float)(uVar63 ^ auVar32._4_4_);
        local_2600._24_4_ = (float)(uVar64 ^ auVar32._8_4_);
        local_2600._28_4_ = (float)(uVar65 ^ auVar32._12_4_);
        auVar42 = ZEXT816(0) << 0x20;
        auVar32 = vcmpps_avx(local_2600._0_16_,auVar42,5);
        auVar39 = vcmpps_avx(local_2600._16_16_,auVar42,5);
        auVar32 = vandps_avx(auVar39,auVar32);
        auVar43._8_4_ = 0x7fffffff;
        auVar43._0_8_ = 0x7fffffff7fffffff;
        auVar43._12_4_ = 0x7fffffff;
        local_25d0 = vandps_avx(auVar47,auVar43);
        auVar39 = vcmpps_avx(auVar47,auVar42,4);
        auVar32 = vandps_avx(auVar32,auVar39);
        auVar70._0_4_ = local_2600._0_4_ + local_2600._16_4_;
        auVar70._4_4_ = local_2600._4_4_ + local_2600._20_4_;
        auVar70._8_4_ = local_2600._8_4_ + local_2600._24_4_;
        auVar70._12_4_ = local_2600._12_4_ + local_2600._28_4_;
        auVar39 = vcmpps_avx(auVar70,local_25d0,2);
        auVar42 = auVar39 & auVar32;
        if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar42[0xf] < '\0') {
          auVar32 = vandps_avx(auVar32,auVar39);
          auVar48._0_4_ = local_2550[0]._0_4_ * auVar35._0_4_;
          auVar48._4_4_ = local_2550[0]._4_4_ * auVar35._4_4_;
          auVar48._8_4_ = local_2550[0]._8_4_ * auVar35._8_4_;
          auVar48._12_4_ = local_2550[0]._12_4_ * auVar35._12_4_;
          auVar39 = vfmadd213ps_fma(auVar49,local_2560,auVar48);
          auVar39 = vfmadd213ps_fma(auVar40,local_2570,auVar39);
          local_25e0._0_4_ = (float)(uVar58 ^ auVar39._0_4_);
          local_25e0._4_4_ = (float)(uVar63 ^ auVar39._4_4_);
          local_25e0._8_4_ = (float)(uVar64 ^ auVar39._8_4_);
          local_25e0._12_4_ = (float)(uVar65 ^ auVar39._12_4_);
          fVar41 = *(float *)(ray + k * 4 + 0x30);
          auVar40._0_4_ = local_25d0._0_4_ * fVar41;
          auVar40._4_4_ = local_25d0._4_4_ * fVar41;
          auVar40._8_4_ = local_25d0._8_4_ * fVar41;
          auVar40._12_4_ = local_25d0._12_4_ * fVar41;
          auVar39 = vcmpps_avx(auVar40,local_25e0,1);
          fVar41 = *(float *)(ray + k * 4 + 0x80);
          auVar49._0_4_ = local_25d0._0_4_ * fVar41;
          auVar49._4_4_ = local_25d0._4_4_ * fVar41;
          auVar49._8_4_ = local_25d0._8_4_ * fVar41;
          auVar49._12_4_ = local_25d0._12_4_ * fVar41;
          auVar42 = vcmpps_avx(local_25e0,auVar49,2);
          auVar39 = vandps_avx(auVar39,auVar42);
          auVar42 = auVar32 & auVar39;
          if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar42[0xf] < '\0') {
            local_26c0 = vandps_avx(auVar32,auVar39);
            local_25b0 = local_26c0;
            auVar32 = vrcpps_avx(local_25d0);
            auVar35._8_4_ = 0x3f800000;
            auVar35._0_8_ = &DAT_3f8000003f800000;
            auVar35._12_4_ = 0x3f800000;
            auVar39 = vfnmadd213ps_fma(local_25d0,auVar32,auVar35);
            auVar32 = vfmadd132ps_fma(auVar39,auVar32,auVar32);
            fVar41 = auVar32._0_4_;
            local_2580._0_4_ = fVar41 * local_25e0._0_4_;
            fVar44 = auVar32._4_4_;
            local_2580._4_4_ = fVar44 * local_25e0._4_4_;
            fVar45 = auVar32._8_4_;
            local_2580._8_4_ = fVar45 * local_25e0._8_4_;
            fVar46 = auVar32._12_4_;
            local_2580._12_4_ = fVar46 * local_25e0._12_4_;
            auVar31 = ZEXT1664(local_2580);
            local_25a0[0] = fVar41 * local_2600._0_4_;
            local_25a0[1] = fVar44 * local_2600._4_4_;
            local_25a0[2] = fVar45 * local_2600._8_4_;
            local_25a0[3] = fVar46 * local_2600._12_4_;
            auVar36._8_4_ = 0x7f800000;
            auVar36._0_8_ = 0x7f8000007f800000;
            auVar36._12_4_ = 0x7f800000;
            auVar32 = vblendvps_avx(auVar36,local_2580,local_26c0);
            local_2590[0] = fVar41 * local_2600._16_4_;
            local_2590[1] = fVar44 * local_2600._20_4_;
            local_2590[2] = fVar45 * local_2600._24_4_;
            local_2590[3] = fVar46 * local_2600._28_4_;
            auVar39 = vshufps_avx(auVar32,auVar32,0xb1);
            auVar39 = vminps_avx(auVar39,auVar32);
            auVar42 = vshufpd_avx(auVar39,auVar39,1);
            auVar39 = vminps_avx(auVar42,auVar39);
            auVar39 = vcmpps_avx(auVar32,auVar39,0);
            auVar42 = local_26c0 & auVar39;
            auVar32 = vpcmpeqd_avx(auVar32,auVar32);
            if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar42[0xf] < '\0') {
              auVar32 = auVar39;
            }
            auVar32 = vandps_avx(local_26c0,auVar32);
            uVar14 = vmovmskps_avx(auVar32);
            local_2680 = 0;
            for (uVar27 = CONCAT44((int)((ulong)lVar16 >> 0x20),uVar14); local_26a8 = pSVar17,
                (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              local_2680 = local_2680 + 1;
            }
            do {
              uVar58 = *(uint *)((long)&local_2520 + local_2680 * 4);
              uVar27 = (ulong)uVar58;
              local_2688 = (pSVar17->geometries).items[uVar27].ptr;
              if ((local_2688->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_26c0 + local_2680 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_2688->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar41 = local_25a0[local_2680];
                  fVar44 = local_2590[local_2680];
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2580 + local_2680 * 4)
                  ;
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2570 + local_2680 * 4)
                  ;
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2560 + local_2680 * 4)
                  ;
                  *(undefined4 *)(ray + k * 4 + 0xe0) =
                       *(undefined4 *)(local_2550[0] + local_2680 * 4);
                  *(float *)(ray + k * 4 + 0xf0) = fVar41;
                  *(float *)(ray + k * 4 + 0x100) = fVar44;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_2610 + local_2680 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar58;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                local_2530 = auVar31._0_16_;
                local_2480 = auVar80._0_32_;
                fVar41 = local_25a0[local_2680];
                local_24e0._4_4_ = fVar41;
                local_24e0._0_4_ = fVar41;
                local_24e0._8_4_ = fVar41;
                local_24e0._12_4_ = fVar41;
                local_24d0 = local_2590[local_2680];
                local_24b0._4_4_ = uVar58;
                local_24b0._0_4_ = uVar58;
                local_24b0._8_4_ = uVar58;
                local_24b0._12_4_ = uVar58;
                uVar14 = *(undefined4 *)((long)&local_2610 + local_2680 * 4);
                local_24c0._4_4_ = uVar14;
                local_24c0._0_4_ = uVar14;
                local_24c0._8_4_ = uVar14;
                local_24c0._12_4_ = uVar14;
                uVar14 = *(undefined4 *)(local_2570 + local_2680 * 4);
                uVar2 = *(undefined4 *)(local_2560 + local_2680 * 4);
                local_2500._4_4_ = uVar2;
                local_2500._0_4_ = uVar2;
                local_2500._8_4_ = uVar2;
                local_2500._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_2550[0] + local_2680 * 4);
                local_24f0._4_4_ = uVar2;
                local_24f0._0_4_ = uVar2;
                local_24f0._8_4_ = uVar2;
                local_24f0._12_4_ = uVar2;
                local_2510[0] = (RTCHitN)(char)uVar14;
                local_2510[1] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_2510[2] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_2510[3] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_2510[4] = (RTCHitN)(char)uVar14;
                local_2510[5] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_2510[6] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_2510[7] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_2510[8] = (RTCHitN)(char)uVar14;
                local_2510[9] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_2510[10] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_2510[0xb] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_2510[0xc] = (RTCHitN)(char)uVar14;
                local_2510[0xd] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_2510[0xe] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_2510[0xf] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                fStack_24cc = local_24d0;
                fStack_24c8 = local_24d0;
                fStack_24c4 = local_24d0;
                vpcmpeqd_avx2(ZEXT1632(local_24e0),ZEXT1632(local_24e0));
                uStack_249c = context->user->instID[0];
                local_24a0 = uStack_249c;
                uStack_2498 = uStack_249c;
                uStack_2494 = uStack_249c;
                uStack_2490 = context->user->instPrimID[0];
                uStack_248c = uStack_2490;
                uStack_2488 = uStack_2490;
                uStack_2484 = uStack_2490;
                uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2580 + local_2680 * 4);
                local_26a0 = *local_2668;
                uStack_2698 = local_2668[1];
                local_2640.valid = (int *)&local_26a0;
                local_2640.geometryUserPtr = local_2688->userPtr;
                local_2640.context = context->user;
                local_2640.hit = local_2510;
                local_2640.N = 4;
                local_2678 = uVar22;
                local_2670 = uVar24;
                local_2640.ray = (RTCRayN *)ray;
                if (local_2688->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_2688->intersectionFilterN)(&local_2640);
                }
                auVar12._8_8_ = uStack_2698;
                auVar12._0_8_ = local_26a0;
                if (auVar12 == (undefined1  [16])0x0) {
                  auVar32 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar32 = auVar32 ^ _DAT_01febe20;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_2688->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var8)(&local_2640);
                  }
                  auVar13._8_8_ = uStack_2698;
                  auVar13._0_8_ = local_26a0;
                  auVar39 = vpcmpeqd_avx(auVar13,_DAT_01feba10);
                  auVar32 = auVar39 ^ _DAT_01febe20;
                  if (auVar13 != (undefined1  [16])0x0) {
                    auVar39 = auVar39 ^ _DAT_01febe20;
                    auVar42 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])local_2640.hit);
                    *(undefined1 (*) [16])(local_2640.ray + 0xc0) = auVar42;
                    auVar42 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2640.hit + 0x10));
                    *(undefined1 (*) [16])(local_2640.ray + 0xd0) = auVar42;
                    auVar42 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2640.hit + 0x20));
                    *(undefined1 (*) [16])(local_2640.ray + 0xe0) = auVar42;
                    auVar42 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2640.hit + 0x30));
                    *(undefined1 (*) [16])(local_2640.ray + 0xf0) = auVar42;
                    auVar42 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2640.hit + 0x40));
                    *(undefined1 (*) [16])(local_2640.ray + 0x100) = auVar42;
                    auVar42 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2640.hit + 0x50));
                    *(undefined1 (*) [16])(local_2640.ray + 0x110) = auVar42;
                    auVar42 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2640.hit + 0x60));
                    *(undefined1 (*) [16])(local_2640.ray + 0x120) = auVar42;
                    auVar42 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2640.hit + 0x70));
                    *(undefined1 (*) [16])(local_2640.ray + 0x130) = auVar42;
                    auVar39 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2640.hit + 0x80));
                    *(undefined1 (*) [16])(local_2640.ray + 0x140) = auVar39;
                  }
                }
                auVar38._8_8_ = 0x100000001;
                auVar38._0_8_ = 0x100000001;
                if ((auVar38 & auVar32) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar14;
                }
                *(undefined4 *)(local_26c0 + local_2680 * 4) = 0;
                uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar30._4_4_ = uVar14;
                auVar30._0_4_ = uVar14;
                auVar30._8_4_ = uVar14;
                auVar30._12_4_ = uVar14;
                auVar31 = ZEXT1664(local_2530);
                auVar32 = vcmpps_avx(local_2530,auVar30,2);
                local_26c0 = vandps_avx(auVar32,local_26c0);
                auVar80 = ZEXT3264(local_2480);
                uVar27 = local_2680;
                pSVar17 = local_26a8;
                uVar22 = local_2678;
                uVar24 = local_2670;
              }
              if ((((local_26c0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_26c0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_26c0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_26c0[0xf]) break;
              auVar37._8_4_ = 0x7f800000;
              auVar37._0_8_ = 0x7f8000007f800000;
              auVar37._12_4_ = 0x7f800000;
              auVar32 = vblendvps_avx(auVar37,auVar31._0_16_,local_26c0);
              auVar39 = vshufps_avx(auVar32,auVar32,0xb1);
              auVar39 = vminps_avx(auVar39,auVar32);
              auVar42 = vshufpd_avx(auVar39,auVar39,1);
              auVar39 = vminps_avx(auVar42,auVar39);
              auVar39 = vcmpps_avx(auVar32,auVar39,0);
              auVar42 = local_26c0 & auVar39;
              auVar32 = local_26c0;
              if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar42[0xf] < '\0') {
                auVar32 = vandps_avx(auVar39,local_26c0);
              }
              uVar14 = vmovmskps_avx(auVar32);
              local_2680 = 0;
              for (uVar27 = CONCAT44((int)(uVar27 >> 0x20),uVar14); (uVar27 & 1) == 0;
                  uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                local_2680 = local_2680 + 1;
              }
            } while( true );
          }
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 != local_2658);
    }
    uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar31 = ZEXT3264(CONCAT428(uVar14,CONCAT424(uVar14,CONCAT420(uVar14,CONCAT416(uVar14,CONCAT412
                                                  (uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))))
                                                  ))));
    auVar51 = ZEXT3264(local_23c0);
    auVar54 = ZEXT3264(local_23e0);
    auVar57 = ZEXT3264(local_2400);
    auVar62 = ZEXT3264(local_2420);
    auVar68 = ZEXT3264(local_2440);
    auVar71 = ZEXT3264(local_2460);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }